

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

void __thiscall
Js::ScriptContext::VerifyAliveWithHostContext
          (ScriptContext *this,BOOL isJSFunction,HostScriptContext *requestHostScriptContext)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  ScriptContext *requestScriptContext;
  
  if (requestHostScriptContext == (HostScriptContext *)0x0) {
    if (this->threadContext->isThreadBound == true) {
      iVar3 = (*this->hostScriptContext->_vptr_HostScriptContext[10])();
      if (iVar3 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                    ,0x640,
                                    "(GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller())"
                                    ,
                                    "GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller()"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    requestScriptContext = (ScriptContext *)0x0;
  }
  else {
    requestScriptContext = requestHostScriptContext->scriptContext;
  }
  VerifyAlive(this,isJSFunction,requestScriptContext);
  return;
}

Assistant:

void ScriptContext::VerifyAliveWithHostContext(BOOL isJSFunction, HostScriptContext* requestHostScriptContext)
    {
        if (requestHostScriptContext)
        {
            VerifyAlive(isJSFunction, requestHostScriptContext->GetScriptContext());
        }
        else
        {
            Assert(GetThreadContext()->IsJSRT() || !GetHostScriptContext()->HasCaller());
            VerifyAlive(isJSFunction, NULL);
        }
    }